

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O3

void __thiscall nonblocking_unit_test::main(nonblocking_unit_test *this,string *param_1)

{
  bool bVar1;
  int iVar2;
  binder *this_00;
  self_ptr p;
  intrusive_ptr<nonblocking_unit_test::binder> local_30;
  shared_ptr<cppcms::http::context> local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Running non-blocking test",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  iVar2 = cppcms::application::response();
  cppcms::http::response::setbuf(iVar2);
  bVar1 = (bool)cppcms::application::response();
  cppcms::http::response::full_asynchronous_buffering(bVar1);
  calls = calls + 1;
  this_00 = (binder *)operator_new(0x28);
  cppcms::application::release_context();
  binder::binder(this_00,&local_28);
  local_30.p_ = this_00;
  booster::atomic_counter::inc();
  if (local_28.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (*(this_00->super_callable<void_(cppcms::http::context::completion_type)>).super_refcounted.
    _vptr_refcounted[2])(this_00,0);
  booster::intrusive_ptr<nonblocking_unit_test::binder>::~intrusive_ptr(&local_30);
  return;
}

Assistant:

void main(std::string)
	{
		std::cout << "Running non-blocking test" << std::endl;
		response().setbuf(0);
		response().full_asynchronous_buffering(false);
		calls ++;
		binder::self_ptr p(new binder(release_context()));
		p->run();
	}